

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int ON_Texture::Compare(ON_Texture *a,ON_Texture *b)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ON_wString *this;
  ON_wString *this_00;
  wchar_t *other_path;
  
  iVar4 = ON_UuidCompare(&a->m_texture_id,&b->m_texture_id);
  if (iVar4 == 0) {
    iVar3 = iVar4;
    if (b->m_mapping_channel_id < a->m_mapping_channel_id) {
      iVar3 = 1;
    }
    iVar4 = -1;
    if (b->m_mapping_channel_id <= a->m_mapping_channel_id) {
      iVar4 = iVar3;
    }
    if (iVar4 == 0) {
      this = ON_FileReference::FullPath(&a->m_image_file_reference);
      this_00 = ON_FileReference::FullPath(&b->m_image_file_reference);
      other_path = ON_wString::operator_cast_to_wchar_t_(this_00);
      iVar4 = ON_wString::ComparePath(this,other_path);
      if ((((((iVar4 == 0) && (iVar4 = (uint)a->m_bOn - (uint)b->m_bOn, iVar4 == 0)) &&
            (iVar4 = a->m_type - b->m_type, iVar4 == 0)) &&
           ((iVar4 = a->m_mode - b->m_mode, iVar4 == 0 &&
            (iVar4 = a->m_minfilter - b->m_minfilter, iVar4 == 0)))) &&
          ((iVar4 = a->m_magfilter - b->m_magfilter, iVar4 == 0 &&
           ((iVar4 = a->m_wrapu - b->m_wrapu, iVar4 == 0 &&
            (iVar4 = a->m_wrapv - b->m_wrapv, iVar4 == 0)))))) &&
         ((iVar4 = a->m_wrapw - b->m_wrapw, iVar4 == 0 &&
          ((((iVar4 = CompareXform(&a->m_uvw,&b->m_uvw), iVar4 == 0 &&
             (iVar4 = ON_Color::Compare(&a->m_border_color,&b->m_border_color), iVar4 == 0)) &&
            (iVar4 = ON_Color::Compare(&a->m_transparent_color,&b->m_transparent_color), iVar4 == 0)
            ) && (iVar4 = ON_Interval::Compare(&a->m_bump_scale,&b->m_bump_scale), iVar4 == 0))))))
      {
        dVar1 = a->m_blend_constant_A;
        dVar2 = b->m_blend_constant_A;
        iVar4 = -1;
        if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
          iVar4 = 0;
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            if (NAN(dVar1)) {
              iVar4 = -(uint)!NAN(dVar2);
            }
            else {
              iVar4 = -1;
              if (!NAN(dVar2)) {
                iVar4 = 0;
              }
            }
          }
        }
        if (iVar4 == 0) {
          dVar1 = a->m_blend_A0;
          dVar2 = b->m_blend_A0;
          iVar4 = -1;
          if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
            iVar4 = 0;
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              if (NAN(dVar1)) {
                iVar4 = -(uint)!NAN(dVar2);
              }
              else {
                iVar4 = -1;
                if (!NAN(dVar2)) {
                  iVar4 = 0;
                }
              }
            }
          }
          if (iVar4 == 0) {
            dVar1 = a->m_blend_A1;
            dVar2 = b->m_blend_A1;
            iVar4 = -1;
            if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
              iVar4 = 0;
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                if (NAN(dVar1)) {
                  iVar4 = -(uint)!NAN(dVar2);
                }
                else {
                  iVar4 = -1;
                  if (!NAN(dVar2)) {
                    iVar4 = 0;
                  }
                }
              }
            }
            if (iVar4 == 0) {
              dVar1 = a->m_blend_A2;
              dVar2 = b->m_blend_A2;
              iVar4 = -1;
              if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
                iVar4 = 0;
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                  if (NAN(dVar1)) {
                    iVar4 = -(uint)!NAN(dVar2);
                  }
                  else {
                    iVar4 = -1;
                    if (!NAN(dVar2)) {
                      iVar4 = 0;
                    }
                  }
                }
              }
              if (iVar4 == 0) {
                dVar1 = a->m_blend_A3;
                dVar2 = b->m_blend_A3;
                iVar4 = -1;
                if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
                  iVar4 = 0;
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                    if (NAN(dVar1)) {
                      iVar4 = -(uint)!NAN(dVar2);
                    }
                    else {
                      iVar4 = -1;
                      if (!NAN(dVar2)) {
                        iVar4 = 0;
                      }
                    }
                  }
                }
                if (iVar4 == 0) {
                  dVar1 = a->m_blend_RGB0;
                  dVar2 = b->m_blend_RGB0;
                  iVar4 = -1;
                  if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
                    iVar4 = 0;
                    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                      if (NAN(dVar1)) {
                        iVar4 = -(uint)!NAN(dVar2);
                      }
                      else {
                        iVar4 = -1;
                        if (!NAN(dVar2)) {
                          iVar4 = 0;
                        }
                      }
                    }
                  }
                  if (iVar4 == 0) {
                    dVar1 = a->m_blend_RGB1;
                    dVar2 = b->m_blend_RGB1;
                    iVar4 = -1;
                    if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
                      iVar4 = 0;
                      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                        if (NAN(dVar1)) {
                          iVar4 = -(uint)!NAN(dVar2);
                        }
                        else {
                          iVar4 = -1;
                          if (!NAN(dVar2)) {
                            iVar4 = 0;
                          }
                        }
                      }
                    }
                    if (iVar4 == 0) {
                      dVar1 = a->m_blend_RGB2;
                      dVar2 = b->m_blend_RGB2;
                      iVar4 = -1;
                      if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
                        iVar4 = 0;
                        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                          if (NAN(dVar1)) {
                            iVar4 = -(uint)!NAN(dVar2);
                          }
                          else {
                            iVar4 = -1;
                            if (!NAN(dVar2)) {
                              iVar4 = 0;
                            }
                          }
                        }
                      }
                      if (iVar4 == 0) {
                        dVar1 = a->m_blend_RGB3;
                        dVar2 = b->m_blend_RGB3;
                        iVar4 = -1;
                        if ((dVar2 <= dVar1) && (iVar4 = 1, dVar1 <= dVar2)) {
                          iVar4 = 0;
                          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                            if (NAN(dVar1)) {
                              iVar4 = -(uint)!NAN(dVar2);
                            }
                            else {
                              iVar4 = -1;
                              if (!NAN(dVar2)) {
                                iVar4 = 0;
                              }
                            }
                          }
                        }
                        if (iVar4 == 0) {
                          iVar4 = (uint)a->m_bTreatAsLinear - (uint)b->m_bTreatAsLinear;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ON_Texture::Compare(const ON_Texture& a, const ON_Texture& b)
{
  int rc = ON_UuidCompare(&a.m_texture_id, &b.m_texture_id);
  while (!rc)
  {
    if (a.m_mapping_channel_id < b.m_mapping_channel_id)
      rc = -1;
    else if (a.m_mapping_channel_id > b.m_mapping_channel_id)
      rc = 1;
    if (rc) break;

    rc = a.m_image_file_reference.FullPath().ComparePath(static_cast< const wchar_t* >(b.m_image_file_reference.FullPath()));
    if (rc) break;

    rc = ((int)(a.m_bOn ? 1 : 0)) - ((int)(b.m_bOn ? 1 : 0));
    if (rc) break;

    rc = ((int)a.m_type) - ((int)b.m_type);
    if (rc) break;

    rc = ((int)a.m_mode) - ((int)b.m_mode);
    if (rc) break;

    rc = ((int)a.m_minfilter) - ((int)b.m_minfilter);
    if (rc) break;

    rc = ((int)a.m_magfilter) - ((int)b.m_magfilter);
    if (rc) break;

    rc = ((int)a.m_wrapu) - ((int)b.m_wrapu);
    if (rc) break;

    rc = ((int)a.m_wrapv) - ((int)b.m_wrapv);
    if (rc) break;

    rc = ((int)a.m_wrapw) - ((int)b.m_wrapw);
    if (rc) break;

    rc = CompareXform(a.m_uvw, b.m_uvw);
    if (rc) break;

    rc = a.m_border_color.Compare(b.m_border_color);
    if (rc) break;

    rc = a.m_transparent_color.Compare(b.m_transparent_color);
    if (rc) break;

    rc = ON_Interval::Compare(a.m_bump_scale, b.m_bump_scale);
    if (rc) break;

    rc = CompareDouble(a.m_blend_constant_A, b.m_blend_constant_A);
    if (rc) break;

    rc = CompareDouble(a.m_blend_A0, b.m_blend_A0);
    if (rc) break;
    rc = CompareDouble(a.m_blend_A1, b.m_blend_A1);
    if (rc) break;
    rc = CompareDouble(a.m_blend_A2, b.m_blend_A2);
    if (rc) break;
    rc = CompareDouble(a.m_blend_A3, b.m_blend_A3);
    if (rc) break;

    rc = CompareDouble(a.m_blend_RGB0, b.m_blend_RGB0);
    if (rc) break;
    rc = CompareDouble(a.m_blend_RGB1, b.m_blend_RGB1);
    if (rc) break;
    rc = CompareDouble(a.m_blend_RGB2, b.m_blend_RGB2);
    if (rc) break;
    rc = CompareDouble(a.m_blend_RGB3, b.m_blend_RGB3);
    if (rc) break;

    rc = ((int)(a.m_bTreatAsLinear ? 1 : 0)) - ((int)(b.m_bTreatAsLinear ? 1 : 0));
    if (rc) break;

    break;
  }

  return rc;
}